

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc_wrapper.cpp
# Opt level: O1

UnicodeType
duckdb::Utf8Proc::Analyze
          (char *s,size_t len,UnicodeInvalidReason *invalid_reason,size_t *invalid_pos)

{
  bool bVar1;
  UnicodeType UVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  size_t sVar12;
  bool bVar13;
  
  UVar2 = ASCII;
  sVar12 = 0;
  do {
    uVar7 = sVar12;
    if (len <= sVar12) {
      return UVar2;
    }
    do {
      sVar12 = uVar7;
      if (len < sVar12 + 8) break;
      uVar7 = sVar12 + 8;
    } while ((*(ulong *)(s + sVar12) & 0x8080808080808080) == 0);
    uVar7 = sVar12 + 8;
    if (len <= sVar12 + 8) {
      uVar7 = len;
    }
    bVar13 = true;
    if (sVar12 < uVar7) {
      do {
        bVar4 = s[sVar12];
        uVar10 = (uint)bVar4;
        iVar5 = 9;
        if ((char)bVar4 < '\0') {
          uVar9 = (uint)bVar4;
          iVar8 = (int)sVar12;
          if ((uVar10 & 0xffffffe0) == 0xc0) {
            if (len - sVar12 < 2) {
LAB_0023447c:
              if (invalid_reason != (UnicodeInvalidReason *)0x0) {
                *invalid_reason = BYTE_MISMATCH;
              }
              UVar2 = INVALID;
              if (invalid_pos != (size_t *)0x0) {
                sVar11 = (long)iVar8;
                UVar2 = INVALID;
LAB_0023455b:
                *invalid_pos = sVar11;
              }
LAB_0023455e:
              iVar5 = 1;
            }
            else {
              uVar10 = uVar10 & 0x1f;
              bVar13 = true;
              do {
                bVar1 = bVar13;
                if (!bVar1) break;
                lVar3 = sVar12 + 1;
                sVar12 = sVar12 + 1;
                bVar4 = s[lVar3] & 0xc0;
                if (bVar4 == 0x80) {
                  uVar10 = uVar10 << 6 | (byte)s[lVar3] & 0x3f;
                }
                else {
                  if (invalid_reason != (UnicodeInvalidReason *)0x0) {
                    *invalid_reason = BYTE_MISMATCH;
                  }
                  if (invalid_pos != (size_t *)0x0) {
                    *invalid_pos = sVar12;
                  }
                }
                bVar13 = false;
              } while (bVar4 == 0x80);
              if (bVar1) goto LAB_00234565;
              uVar9 = uVar10 & 0x780;
joined_r0x00234457:
              if (((uVar9 == 0) || (0x10ffff < (int)uVar10)) || ((uVar10 & 0x1fff800) == 0xd800)) {
                iVar5 = 1;
                if (invalid_reason != (UnicodeInvalidReason *)0x0) {
                  *invalid_reason = INVALID_UNICODE;
                }
                UVar2 = INVALID;
                if (invalid_pos != (size_t *)0x0) {
                  sVar11 = (long)iVar8;
                  goto LAB_0023455b;
                }
              }
              else {
                UVar2 = UNICODE;
                iVar5 = 0;
              }
            }
          }
          else {
            if ((uVar9 & 0xfffffff0) == 0xe0) {
              if (len - sVar12 < 3) goto LAB_0023447c;
              uVar10 = uVar10 & 0xf;
              lVar3 = 1;
              bVar13 = false;
              do {
                sVar12 = sVar12 + 1;
                bVar4 = s[sVar12] & 0xc0;
                if (bVar4 == 0x80) {
                  uVar10 = uVar10 << 6 | (byte)s[sVar12] & 0x3f;
                }
                else {
                  if (invalid_reason != (UnicodeInvalidReason *)0x0) {
                    *invalid_reason = BYTE_MISMATCH;
                  }
                  if (invalid_pos != (size_t *)0x0) {
                    *invalid_pos = sVar12;
                  }
                }
                if (bVar4 != 0x80) break;
                lVar3 = lVar3 + -1;
                bVar13 = lVar3 != 0;
              } while (lVar3 == 0);
              if (bVar13) {
                uVar9 = uVar10 & 0xf800;
                goto joined_r0x00234457;
              }
            }
            else {
              if ((uVar9 & 0xfffffff8) != 0xf0) {
                if (invalid_reason != (UnicodeInvalidReason *)0x0) {
                  *invalid_reason = BYTE_MISMATCH;
                }
                sVar11 = sVar12;
                if (invalid_pos != (size_t *)0x0) goto LAB_0023455b;
                goto LAB_0023455e;
              }
              if (len - sVar12 < 4) goto LAB_0023447c;
              uVar10 = uVar9 & 7;
              bVar13 = false;
              uVar6 = 0;
              do {
                sVar12 = sVar12 + 1;
                bVar4 = s[sVar12] & 0xc0;
                if (bVar4 == 0x80) {
                  uVar10 = uVar10 << 6 | (byte)s[sVar12] & 0x3f;
                }
                else {
                  if (invalid_reason != (UnicodeInvalidReason *)0x0) {
                    *invalid_reason = BYTE_MISMATCH;
                  }
                  if (invalid_pos != (size_t *)0x0) {
                    *invalid_pos = sVar12;
                  }
                }
                if (bVar4 != 0x80) break;
                bVar13 = 1 < uVar6;
                uVar6 = uVar6 + 1;
              } while (uVar6 != 3);
              if (bVar13) {
                uVar9 = uVar10 & 0x1f0000;
                goto joined_r0x00234457;
              }
            }
LAB_00234565:
            iVar5 = 1;
            UVar2 = INVALID;
          }
        }
        if ((iVar5 != 9) && (iVar5 != 0)) goto LAB_0023458c;
        sVar12 = sVar12 + 1;
      } while (sVar12 < uVar7);
      iVar5 = 0;
LAB_0023458c:
      bVar13 = iVar5 == 0;
    }
    if (!bVar13) {
      return INVALID;
    }
  } while( true );
}

Assistant:

UnicodeType Utf8Proc::Analyze(const char *s, size_t len, UnicodeInvalidReason *invalid_reason, size_t *invalid_pos) {
	UnicodeType type = UnicodeType::ASCII;

	static constexpr uint64_t MASK = 0x8080808080808080U;
	for (size_t i = 0; i < len;) {
		// Check 8 bytes at a time until we hit non-ASCII
		for (; i + sizeof(uint64_t) <= len; i += sizeof(uint64_t)) {
			if (Load<uint64_t>(const_data_ptr_cast(s + i)) & MASK) {
				break; // Non-ASCII in the next 8 bytes
			}
		}
		// Check 1 byte at a time for the next 8 bytes
		const auto end = MinValue(i + sizeof(uint64_t), len);
		for (; i < end; i++) {
			int c = (int)s[i];
			if ((c & 0x80) == 0) {
				continue;
			}
			int first_pos_seq = i;

			if ((c & 0xE0) == 0xC0) {
				/* 2 byte sequence */
				int utf8char = c & 0x1F;
				type = UTF8ExtraByteLoop<1, 0x000780>(first_pos_seq, utf8char, i, s, len, invalid_reason, invalid_pos);
			} else if ((c & 0xF0) == 0xE0) {
				/* 3 byte sequence */
				int utf8char = c & 0x0F;
				type = UTF8ExtraByteLoop<2, 0x00F800>(first_pos_seq, utf8char, i, s, len, invalid_reason, invalid_pos);
			} else if ((c & 0xF8) == 0xF0) {
				/* 4 byte sequence */
				int utf8char = c & 0x07;
				type = UTF8ExtraByteLoop<3, 0x1F0000>(first_pos_seq, utf8char, i, s, len, invalid_reason, invalid_pos);
			} else {
				/* invalid UTF-8 start byte */
				AssignInvalidUTF8Reason(invalid_reason, invalid_pos, i, UnicodeInvalidReason::BYTE_MISMATCH);
				return UnicodeType::INVALID;
			}
			if (type == UnicodeType::INVALID) {
				return type;
			}
		}
	}
	return type;
}